

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int experimental_thread_activity_callback_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  void *pvVar2;
  int iVar3;
  size_t __n;
  activity_callback_t local_28;
  void *pvStack_20;
  
  local_28 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_activity_callback_thunk).
             callback;
  pvStack_20 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_activity_callback_thunk).
               uctx;
  if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
    uVar1 = *oldlenp;
    if (uVar1 != 0x10) {
      __n = 0x10;
      if (uVar1 < 0x10) {
        __n = uVar1;
      }
      switchD_012b9b0d::default(oldp,&local_28,__n);
      *oldlenp = __n;
      return 0x16;
    }
    *(activity_callback_t *)oldp = local_28;
    *(void **)((long)oldp + 8) = pvStack_20;
  }
  iVar3 = 0;
  if ((newp != (void *)0x0) && (iVar3 = 0x16, newlen == 0x10)) {
    pvVar2 = *(void **)((long)newp + 8);
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_activity_callback_thunk).callback =
         *newp;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_activity_callback_thunk).uctx =
         pvVar2;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
experimental_thread_activity_callback_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	if (!config_stats) {
		return ENOENT;
	}

	activity_callback_thunk_t t_old = tsd_activity_callback_thunk_get(tsd);
	READ(t_old, activity_callback_thunk_t);

	if (newp != NULL) {
		/*
		 * This initialization is unnecessary.  If it's omitted, though,
		 * clang gets confused and warns on the subsequent use of t_new.
		 */
		activity_callback_thunk_t t_new = {NULL, NULL};
		WRITE(t_new, activity_callback_thunk_t);
		tsd_activity_callback_thunk_set(tsd, t_new);
	}
	ret = 0;
label_return:
	return ret;
}